

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayhelper.cpp
# Opt level: O3

void ArrayHelper::shuffleTrainingData(double **inputs,double **outputs,size_t trainingCount)

{
  double *pdVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  if (trainingCount != 0) {
    lVar4 = 0;
    do {
      iVar2 = rand();
      if ((ulong)(long)iVar2 % trainingCount != 0) {
        lVar3 = (ulong)(long)iVar2 % trainingCount + lVar4;
        pdVar1 = inputs[lVar4];
        inputs[lVar4] = inputs[lVar3];
        inputs[lVar3] = pdVar1;
        pdVar1 = outputs[lVar4];
        outputs[lVar4] = outputs[lVar3];
        outputs[lVar3] = pdVar1;
      }
      lVar4 = lVar4 + 1;
      trainingCount = trainingCount - 1;
    } while (trainingCount != 0);
  }
  return;
}

Assistant:

void ArrayHelper::shuffleTrainingData(double** inputs, double** outputs, size_t trainingCount) {
	for (size_t i = 0; i < trainingCount; ++i) {
		size_t randIndex = i + std::rand() % (trainingCount - i);

		if (randIndex != i) {
			double* address = inputs[i];
			inputs[i] = inputs[randIndex];
			inputs[randIndex] = address;

			address = outputs[i];
			outputs[i] = outputs[randIndex];
			outputs[randIndex] = address;
		}
	}
}